

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O2

Def * cmDefinitions::GetInternal(string *key,StackIter begin,StackIter end,bool raise)

{
  StackIter begin_00;
  bool bVar1;
  _Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> _Var2;
  Def *pDVar3;
  _Hashtable<cm::String,std::pair<cm::String_const,cmDefinitions::Def>,std::allocator<std::pair<cm::String_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<cm::String>,std::hash<cm::String>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var4;
  pair<std::__detail::_Node_iterator<std::pair<const_cm::String,_cmDefinitions::Def>,_false,_false>,_bool>
  pVar5;
  StackIter begin_local;
  StackIter it;
  
  begin_local.Position = begin.Position;
  begin_local.Tree = begin.Tree;
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&begin_local,end);
  if (!bVar1) {
    __assert_fail("begin != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDefinitions.cxx"
                  ,0x11,
                  "static const cmDefinitions::Def &cmDefinitions::GetInternal(const std::string &, StackIter, StackIter, bool)"
                 );
  }
  this = (_Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)cmLinkedTree<cmDefinitions>::iterator::operator->(&begin_local);
  it.Tree = (cmLinkedTree<cmDefinitions> *)0x0;
  it.Position = 0;
  _Var2._M_cur = (__node_type *)
                 std::
                 _Hashtable<cm::String,_std::pair<const_cm::String,_cmDefinitions::Def>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<cm::String>,_std::hash<cm::String>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(this,(key_type *)&it);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&it.Position);
  cmLinkedTree<cmDefinitions>::iterator::operator->(&begin_local);
  if (_Var2._M_cur == (__node_type *)0x0) {
    it.Tree = begin_local.Tree;
    it.Position = begin_local.Position;
    cmLinkedTree<cmDefinitions>::iterator::operator++(&it);
    bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator==(&it,end);
    if (bVar1) {
      return &NoDef;
    }
    begin_00.Position = it.Position;
    begin_00.Tree = it.Tree;
    pDVar3 = GetInternal(key,begin_00,end,raise);
    if (!raise) {
      return pDVar3;
    }
    p_Var4 = (_Hashtable<cm::String,std::pair<cm::String_const,cmDefinitions::Def>,std::allocator<std::pair<cm::String_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<cm::String>,std::hash<cm::String>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)cmLinkedTree<cmDefinitions>::iterator::operator->(&begin_local);
    pVar5 = std::
            _Hashtable<cm::String,std::pair<cm::String_const,cmDefinitions::Def>,std::allocator<std::pair<cm::String_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<cm::String>,std::hash<cm::String>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,cmDefinitions::Def_const&>(p_Var4,key,pDVar3);
    _Var2._M_cur = (__node_type *)
                   pVar5.first.
                   super__Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false>
                   ._M_cur;
  }
  return (Def *)((long)&((_Var2._M_cur)->
                        super__Hash_node_value<std::pair<const_cm::String,_cmDefinitions::Def>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_cm::String,_cmDefinitions::Def>_>
                        ._M_storage._M_storage + 0x20);
}

Assistant:

cmDefinitions::Def const& cmDefinitions::GetInternal(const std::string& key,
                                                     StackIter begin,
                                                     StackIter end, bool raise)
{
  assert(begin != end);
  {
    auto it = begin->Map.find(cm::String::borrow(key));
    if (it != begin->Map.end()) {
      return it->second;
    }
  }
  StackIter it = begin;
  ++it;
  if (it == end) {
    return cmDefinitions::NoDef;
  }
  Def const& def = cmDefinitions::GetInternal(key, it, end, raise);
  if (!raise) {
    return def;
  }
  return begin->Map.emplace(key, def).first->second;
}